

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O0

size_t Tools::leaf_index(bitset_t *split)

{
  size_type sVar1;
  size_type sVar2;
  long lVar3;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  invalid_argument *this_01;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa0;
  size_t local_8;
  
  sVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                    (in_stack_ffffffffffffffa0);
  if (sVar1 == 1) {
    sVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI);
    sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ffe52);
    lVar3 = sVar1 - sVar2;
  }
  else {
    this = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
           boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                     (in_stack_ffffffffffffffa0);
    sVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI);
    if (this != (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)(sVar1 - 1)) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_01,"Not a leaf");
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    this_00 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
              boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~(this);
    sVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x1ffec2);
    lVar3 = (long)this_00 - sVar1;
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(this_00);
  }
  local_8 = lVar3 - 1;
  return local_8;
}

Assistant:

size_t Tools::leaf_index(const bitset_t split) {
    if (split.count() == 1) {
        return split.size() - split.find_first() - 1;
    }
    else if (split.count() == split.size() - 1) {
        return split.size() - (~split).find_first() - 1;
    }
    else {
        throw std::invalid_argument("Not a leaf");
    }
}